

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long>::PrepareZ
          (TPZMatrix<long> *this,TPZFMatrix<long> *y,TPZFMatrix<long> *z,long beta,int opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar2 = (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar1,lVar2);
  if (0 < lVar2) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      if (((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow < 1) ||
         ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar5)) {
        TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (beta == 0) {
        if (lVar1 != 0) {
          memset(z->fElem + (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar5,0,lVar1 * 8)
          ;
        }
      }
      else {
        if (z != y) {
          memcpy(z->fElem + (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar5,
                 y->fElem + (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar5,lVar1 * 8);
        }
        if (0 < lVar1) {
          lVar6 = 0;
          do {
            if (((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow <= lVar6) ||
               ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar5)) {
              TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar3 = (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar4;
            *(long *)((long)z->fElem + lVar6 * 8 + lVar3) =
                 *(long *)((long)z->fElem + lVar6 * 8 + lVar3) * beta;
            lVar6 = lVar6 + 1;
          } while (lVar1 != lVar6);
        }
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar5 != lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}